

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

void do_db(int *ip)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  t_symbol *ptVar4;
  uint data;
  int iVar5;
  ushort **ppuVar6;
  char *pcVar7;
  int iVar8;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  data_level = 2;
  ppuVar6 = __ctype_b_loc();
  puVar3 = *ppuVar6;
  iVar8 = *ip;
  pcVar7 = prlnbuf + iVar8;
  do {
    iVar8 = iVar8 + 1;
    pcVar7 = pcVar7 + 1;
    *ip = iVar8;
  } while ((*(byte *)((long)puVar3 + (long)*pcVar7 * 2 + 1) & 0x20) != 0);
LAB_0010a0b5:
  if (prlnbuf[*ip] == '\"') {
    do {
      iVar8 = *ip;
      *ip = iVar8 + 1;
      bVar1 = prlnbuf[(long)iVar8 + 1];
      data = (uint)bVar1;
      if (bVar1 == 0x5c) {
        *ip = iVar8 + 2;
        bVar1 = prlnbuf[(long)iVar8 + 2];
        data = (uint)bVar1;
        if (bVar1 == 0x6e) {
          data = 10;
        }
        else if (bVar1 == 0x74) {
          data = 9;
        }
        else if (bVar1 == 0x72) {
          data = 0xd;
        }
      }
      else {
        if (bVar1 == 0x22) goto LAB_0010a160;
        if (bVar1 == 0) {
          pcVar7 = "Unterminated ASCII string!";
          goto LAB_0010a1c5;
        }
      }
      if (pass == 1) {
        putbyte(loccnt,data);
      }
      loccnt = loccnt + 1;
    } while( true );
  }
  iVar5 = evaluate(ip,'\0');
  iVar8 = loccnt;
  if (iVar5 == 0) {
    return;
  }
  loccnt = loccnt + 1;
  if (pass == 1) {
    if (0xfffffe7f < value - 0x100) {
      putbyte(iVar8,value);
      goto LAB_0010a165;
    }
    pcVar7 = "Overflow error!";
    goto LAB_0010a1c5;
  }
LAB_0010a165:
  iVar8 = *ip;
  *ip = iVar8 + 1;
  ptVar4 = lablptr;
  cVar2 = prlnbuf[iVar8];
  if (cVar2 != ',') {
    if ((cVar2 == '\0') || (cVar2 == ';')) {
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 0)) {
          lastlabl->data_size = lastlabl->data_size + (loccnt - data_loccnt);
        }
      }
      else {
        lablptr->data_type = 0;
        ptVar4->data_size = loccnt - data_loccnt;
      }
      if (pass != 1) {
        return;
      }
      println();
      return;
    }
    pcVar7 = "Syntax error!";
LAB_0010a1c5:
    error(pcVar7);
    return;
  }
  goto LAB_0010a0b5;
LAB_0010a160:
  *ip = iVar8 + 2;
  goto LAB_0010a165;
}

Assistant:

void
do_db(int *ip)
{
	unsigned char c;

	/* define label */
	labldef(loccnt, 1);

	/* output infos */
	data_loccnt = loccnt;
	data_level  = 2;

	/* skip spaces */
	while (isspace(prlnbuf[++(*ip)]));

	/* get bytes */
	for (;;) {
		/* ASCII string */
		if (prlnbuf[*ip] == '\"') {
			for (;;) {
				c = prlnbuf[++(*ip)];
				if (c == '\"')
					break;
				if (c == '\0') {
					error("Unterminated ASCII string!");
					return;
				}
				if (c == '\\') {
					c = prlnbuf[++(*ip)];
					switch(c) {
					case 'r':
						c = '\r';
						break;
					case 'n':
						c = '\n';
						break;
					case 't':
						c = '\t';
						break;
					}
				}
				/* store char on last pass */
				if (pass == LAST_PASS)
					putbyte(loccnt, c);

				/* update location counter */
				loccnt++;
			}
			(*ip)++;
		}
		/* bytes */
		else {
			/* get a byte */
			if (!evaluate(ip, 0))
				return;

			/* update location counter */
			loccnt++;

			/* store byte on last pass */
			if (pass == LAST_PASS) {
				/* check for overflow */
				if ((value > 0xFF) && (value < 0xFFFFFF80)) {
					error("Overflow error!");
					return;
				}

				/* store byte */
				putbyte(loccnt - 1, value);
			}
		}

		/* check if there's another byte */
		c = prlnbuf[(*ip)++];

		if (c != ',')
			break;
	}

	/* check error */
	if (c != ';' && c != '\0') {
		error("Syntax error!");
		return;
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_DB;
		lablptr->data_size = loccnt - data_loccnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_DB)
				lastlabl->data_size += loccnt - data_loccnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();
}